

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O0

int Hop_ManConvertAigToTruth_rec1(Hop_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  int Counter;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTruth.c"
                  ,0x4c,"int Hop_ManConvertAigToTruth_rec1(Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar4 = Hop_ObjFanin0(pObj);
    iVar1 = Hop_ManConvertAigToTruth_rec1(pHVar4);
    pHVar4 = Hop_ObjFanin1(pObj);
    iVar2 = Hop_ManConvertAigToTruth_rec1(pHVar4);
    iVar3 = Hop_ObjIsMarkA(pObj);
    if (iVar3 == 0) {
      Hop_ObjSetMarkA(pObj);
      return iVar2 + iVar1 + 1;
    }
    __assert_fail("!Hop_ObjIsMarkA(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopTruth.c"
                  ,0x51,"int Hop_ManConvertAigToTruth_rec1(Hop_Obj_t *)");
  }
  return 0;
}

Assistant:

int Hop_ManConvertAigToTruth_rec1( Hop_Obj_t * pObj )
{
    int Counter = 0;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return 0;
    Counter += Hop_ManConvertAigToTruth_rec1( Hop_ObjFanin0(pObj) ); 
    Counter += Hop_ManConvertAigToTruth_rec1( Hop_ObjFanin1(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
    return Counter + 1;
}